

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

string * __thiscall
compiler::AssemblerCompiler::do_assignment_abi_cxx11_
          (string *__return_storage_ptr__,AssemblerCompiler *this,Assignment *assignment)

{
  char *__lhs;
  socklen_t *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  anon_class_8_1_daa3d08b local_28;
  anon_class_8_1_daa3d08b common_prefix;
  Assignment *assignment_local;
  AssemblerCompiler *this_local;
  
  local_28.assignment = (Assignment **)&common_prefix;
  common_prefix.assignment = (Assignment **)assignment;
  __lhs = do_assignment::anon_class_8_1_daa3d08b::operator()(&local_28);
  Var::accept_abi_cxx11_((Var *)local_a8,(int)common_prefix.assignment[1],(sockaddr *)this,in_RCX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_a8 + 0x20),__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  std::operator+(&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_a8 + 0x20)," ");
  (**(common_prefix.assignment[2]->super_Statement).super_Object._vptr_Object)
            (&local_d8,common_prefix.assignment[2],this);
  std::operator+(&local_48,&local_68,&local_d8);
  std::operator+(__return_storage_ptr__,&local_48,";");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)(local_a8 + 0x20));
  std::__cxx11::string::~string((string *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblerCompiler::do_assignment(const Assignment *assignment) {
    auto common_prefix = [&] {
        if (assignment->expression->describe() == "Const") {
            return "MOVC ";
        } else {
            return "MOV ";
        }
    };
    return common_prefix() + assignment->variable->accept(this) + " " + assignment->expression->accept(this) + ";";
}